

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O2

void __thiscall Vector<Fad<double>_>::reserve(Vector<Fad<double>_> *this,int ssize)

{
  long *plVar1;
  ulong uVar2;
  long lVar3;
  Fad<double> *this_00;
  long lVar4;
  
  if (ssize != 0) {
    this->num_elts = ssize;
    lVar3 = (long)ssize * 0x20;
    uVar2 = 0xffffffffffffffff;
    if (-1 < ssize) {
      uVar2 = lVar3 + 8;
    }
    plVar1 = (long *)operator_new__(uVar2);
    *plVar1 = (long)ssize;
    lVar4 = 0;
    this_00 = (Fad<double> *)(plVar1 + 1);
    do {
      Fad<double>::Fad(this_00);
      lVar4 = lVar4 + -0x20;
      this_00 = this_00 + 1;
    } while (-lVar4 != lVar3);
    this->ptr_to_data = (Fad<double> *)(plVar1 + 1);
  }
  return;
}

Assistant:

inline void Vector< T >::reserve(int ssize)
{
#ifdef CHECK_SIZE
    if ( ptr_to_data != 0 ) error("Vector<>::reserve(), array already allocted");

    if ( ssize <0 ) error("Vector<>::reserve(), negative size");
#endif

    if (ssize != 0){
	num_elts = ssize;
	ptr_to_data = new T[num_elts];              
	
	if ( ptr_to_data == 0 ) error("Vector<>::reserve(), not enough memory");
    }
#ifdef DEBUG
    fprintf(stderr,"Vector<>::reserve()         |                   | adr =  %x \n", ptr_to_data);
#endif
}